

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapSort.c
# Opt level: O3

void HeapSort(int *sort,int length)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)length;
  if (1 < length) {
    uVar3 = ((uint)length >> 1) + 1;
    do {
      HeapAdjust(sort,uVar3 - 2,length);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  if (0 < length) {
    do {
      iVar1 = sort[uVar4 - 1];
      sort[uVar4 - 1] = *sort;
      *sort = iVar1;
      HeapAdjust(sort,0,(int)(uVar4 - 1));
      bVar2 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void HeapSort(int sort[], int length)
{
    // 初始化堆
    // length / 2 - 1是二叉树中最后一个非叶子结点的序号
    for (int i = length / 2 - 1; i >= 0; i--)
    {
        HeapAdjust(sort, i, length);
    }
    // 交换堆顶元素和最后一个元素
    for (int i = length - 1; i >= 0; i--)
    {
        int temp;
        temp = sort[i];
        sort[i] = sort[0];
        sort[0] = temp;
        HeapAdjust(sort, 0, i);
    }
}